

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string * flatbuffers::WordWrap
                   (string *__return_storage_ptr__,string *in,size_t max_length,
                   string *wrapped_line_prefix,string *wrapped_line_suffix)

{
  istream *piVar1;
  string word;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream in_stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&in_stream,(string *)in,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  line.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&in_stream,(string *)&word);
  std::__cxx11::string::_M_assign((string *)&line);
  while( true ) {
    piVar1 = std::operator>>((istream *)&in_stream,(string *)&word);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    if (line._M_string_length + word._M_string_length + wrapped_line_suffix->_M_string_length + 1 <
        max_length) {
      std::operator+(&local_1f0," ",&word);
      std::__cxx11::string::append((string *)&line);
    }
    else {
      std::operator+(&local_1d0,&line,wrapped_line_suffix);
      std::operator+(&local_1f0,&local_1d0,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::operator+(&local_1f0,wrapped_line_prefix,&word);
      std::__cxx11::string::operator=((string *)&line,(string *)&local_1f0);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in_stream);
  return __return_storage_ptr__;
}

Assistant:

inline std::string WordWrap(const std::string in, size_t max_length,
                            const std::string wrapped_line_prefix,
                            const std::string wrapped_line_suffix) {
  std::istringstream in_stream(in);
  std::string wrapped, line, word;

  in_stream >> word;
  line = word;

  while (in_stream >> word) {
    if ((line.length() + 1 + word.length() + wrapped_line_suffix.length()) <
        max_length) {
      line += " " + word;
    } else {
      wrapped += line + wrapped_line_suffix + "\n";
      line = wrapped_line_prefix + word;
    }
  }
  wrapped += line;

  return wrapped;
}